

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rand48.cc
# Opt level: O2

float merand48_noadvance(uint64_t v)

{
  return (float)((uint)(v * 0x66d5deece66d + 0x7fffffff >> 0x19) & 0x7fffff | 0x3f800000) + -1.0;
}

Assistant:

float merand48_noadvance(uint64_t v) { return merand48(v); }